

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

void __thiscall Bstrlib::CBString::writeallow(CBString *this)

{
  int iVar1;
  CBStringException *this_00;
  allocator local_59;
  string local_58;
  CBStringException bstr__cppwrapper_exception;
  
  iVar1 = (this->super_tagbstring).mlen;
  if (iVar1 == -1) {
    iVar1 = (this->super_tagbstring).slen;
    (this->super_tagbstring).mlen = iVar1 + (uint)(iVar1 == 0);
  }
  else if (iVar1 < 0) {
    std::__cxx11::string::string
              ((string *)&local_58,"CBString::Cannot unprotect a constant",&local_59);
    CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(this_00,&bstr__cppwrapper_exception);
    __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  return;
}

Assistant:

void CBString::writeallow () {
	if (mlen == -1) mlen = slen + (slen == 0);
	else if (mlen < 0) {
		bstringThrow ("Cannot unprotect a constant");
	}
}